

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool dirichlet_check(int n,double *a)

{
  bool bVar1;
  ostream *poVar2;
  int local_1c;
  bool positive;
  int i;
  double *a_local;
  int n_local;
  
  bVar1 = false;
  local_1c = 0;
  while( true ) {
    if (n <= local_1c) {
      if (!bVar1) {
        std::operator<<((ostream *)&std::cerr," \n");
        std::operator<<((ostream *)&std::cerr,"DIRICHLET_CHECK - Warning!\n");
        std::operator<<((ostream *)&std::cerr,"  All parameters are zero!\n");
      }
      return bVar1;
    }
    if (a[local_1c] <= 0.0) break;
    if (0.0 < a[local_1c]) {
      bVar1 = true;
    }
    local_1c = local_1c + 1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"DIRICHLET_CHECK - Warning!\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"  A[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
  std::operator<<(poVar2,"] <= 0.\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"  A[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
  poVar2 = std::operator<<(poVar2,"] = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,a[local_1c]);
  std::operator<<(poVar2,".\n");
  return false;
}

Assistant:

bool dirichlet_check ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_CHECK checks the parameters of the Dirichlet PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of components.
//
//    Input, double A[N], the probabilities for each component.
//    Each A[I] should be positive.
//
//    Output, bool DIRICHLET_CHECK, is true if the parameters are legal.
//
{
  int i;
  bool positive;

  positive = false;

  for ( i = 0; i < n; i++ )
  {
    if ( a[i] <= 0.0 )
    {
      cerr << " \n";
      cerr << "DIRICHLET_CHECK - Warning!\n";
      cerr << "  A[" << i << "] <= 0.\n";
      cerr << "  A[" << i << "] = " << a[i] << ".\n";
      return false;
    }
    else if ( 0.0 < a[i] )
    {
      positive = true;
    }
  }

  if ( !positive )
  {
    cerr << " \n";
    cerr << "DIRICHLET_CHECK - Warning!\n";
    cerr << "  All parameters are zero!\n";
    return false;
  }

  return true;
}